

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O0

void __thiscall
gmath::PinholeCamera::projectPointLocal(PinholeCamera *this,Vector2d *p,Vector3d *Pc)

{
  long *plVar1;
  double *pdVar2;
  double *pdVar3;
  SVector<double,_3> *in_RDX;
  SVector<double,_2> *in_RSI;
  long in_RDI;
  double dVar4;
  double dVar5;
  double dVar6;
  double y;
  double x;
  Vector3d P;
  double in_stack_ffffffffffffff70;
  SVector<double,_3> *in_stack_ffffffffffffff78;
  SVector<double,_3> local_30;
  SVector<double,_2> *local_10;
  
  local_10 = in_RSI;
  SVector<double,_3>::operator[](in_RDX,2);
  SVector<double,_3>::operator/(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  if (*(long *)(in_RDI + 0x110) != 0) {
    pdVar2 = SVector<double,_3>::operator[](&local_30,0);
    dVar6 = *pdVar2;
    pdVar2 = SVector<double,_3>::operator[](&local_30,1);
    dVar4 = *pdVar2;
    plVar1 = *(long **)(in_RDI + 0x110);
    pdVar2 = SVector<double,_3>::operator[](&local_30,0);
    pdVar3 = SVector<double,_3>::operator[](&local_30,1);
    (**(code **)(*plVar1 + 0x30))(dVar6,dVar4,plVar1,pdVar2,pdVar3);
  }
  dVar4 = SMatrix<double,_3,_3>::operator()((SMatrix<double,_3,_3> *)(in_RDI + 0xc0),0,0);
  pdVar2 = SVector<double,_3>::operator[](&local_30,0);
  dVar6 = *pdVar2;
  dVar5 = SMatrix<double,_3,_3>::operator()((SMatrix<double,_3,_3> *)(in_RDI + 0xc0),0,1);
  pdVar2 = SVector<double,_3>::operator[](&local_30,1);
  dVar6 = dVar4 * dVar6 + dVar5 * *pdVar2;
  dVar4 = SMatrix<double,_3,_3>::operator()((SMatrix<double,_3,_3> *)(in_RDI + 0xc0),0,2);
  pdVar2 = SVector<double,_2>::operator[](local_10,0);
  *pdVar2 = dVar6 + dVar4;
  dVar4 = SMatrix<double,_3,_3>::operator()((SMatrix<double,_3,_3> *)(in_RDI + 0xc0),1,1);
  pdVar2 = SVector<double,_3>::operator[](&local_30,1);
  dVar6 = *pdVar2;
  dVar5 = SMatrix<double,_3,_3>::operator()((SMatrix<double,_3,_3> *)(in_RDI + 0xc0),1,2);
  pdVar2 = SVector<double,_2>::operator[](local_10,1);
  *pdVar2 = dVar4 * dVar6 + dVar5;
  return;
}

Assistant:

void PinholeCamera::projectPointLocal(Vector2d &p, const Vector3d &Pc) const
{
  // apply lens distortion

  Vector3d P=Pc/Pc[2];

  if (dist != 0)
  {
    const double x=P[0];
    const double y=P[1];
    dist->transform(P[0], P[1], x, y);
  }

  // apply camera matrix

  p[0]=A(0, 0)*P[0]+A(0, 1)*P[1]+A(0, 2);
  p[1]=A(1, 1)*P[1]+A(1, 2);
}